

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::updateVerify(HDual *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (this->invertHint == 0) {
    dVar1 = ABS(this->alpha);
    dVar2 = ABS(this->alphaRow);
    dVar3 = dVar2;
    if (dVar1 <= dVar2) {
      dVar3 = dVar1;
    }
    if ((1e-07 < ABS(dVar1 - dVar2) / dVar3) && (0 < this->model->countUpdate)) {
      this->invertHint = 6;
      return;
    }
  }
  return;
}

Assistant:

void HDual::updateVerify() {
	if (invertHint)
		return;

	// The alpha
	double aCol = fabs(alpha);
	double aRow = fabs(alphaRow);
	double aDiff = fabs(aCol - aRow);
	if (aDiff / min(aCol, aRow) > 1e-7 && model->countUpdate > 0) {
	  invertHint = invertHint_possiblySingularBasis; // Was 1
	}

	// We get this thing, but it is not actived by default.
//    // The dual reduced cost
//    double dualin_u = workDual[columnIn];
//    double dualin_c = model->getWorkCost()[columnIn];
//    for (int i = 0; i < column.count; i++) {
//        int iRow = column.index[i];
//        int iCol = model->getBaseIndex()[iRow];
//        double value = column.array[iRow];
//        double cost = model->getWorkCost()[iCol] + model->getWorkShift()[iCol];
//        dualin_c -= cost * value;
//    }
//    double dualin_diff = fabs(dualin_c - dualin_u);
////    if (dualin_diff > Td) {
////        cout << dualin_c << "\t" << dualin_u << "\t" << dualin_diff << endl;
////        invertHint = invertHint_possiblySingularBasis; // Was 1
////    }
}